

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O2

void CreateBackwardReferencesH42
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               BrotliEncoderParams *params,H42 *hasher,int *dist_cache,size_t *last_insert_len,
               Command *commands,size_t *num_commands,size_t *num_literals)

{
  ulong uVar1;
  int *piVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  uint16_t uVar6;
  ushort uVar7;
  size_t sVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  byte bVar15;
  uint uVar16;
  uint uVar17;
  size_t sVar18;
  long lVar19;
  char *pcVar20;
  ushort uVar21;
  ushort uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  uint uVar26;
  ulong uVar27;
  uint uVar28;
  long lVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  long lVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  uint16_t uVar40;
  uint16_t uVar41;
  size_t sVar42;
  bool bVar43;
  bool bVar44;
  ulong local_158;
  ulong local_150;
  ulong local_148;
  ulong local_130;
  ulong local_120;
  size_t local_118;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_e8;
  Command *local_e0;
  ulong local_c8;
  
  uVar11 = (1L << ((byte)params->lgwin & 0x3f)) - 0x10;
  uVar4 = (position - 3) + num_bytes;
  sVar18 = position;
  if (3 < num_bytes) {
    sVar18 = uVar4;
  }
  lVar19 = 0x200;
  if (params->quality < 9) {
    lVar19 = 0x40;
  }
  uVar1 = position + num_bytes;
  uVar5 = (position - 4) + num_bytes;
  lVar3 = position - 1;
  local_118 = *last_insert_len;
  uVar12 = lVar19 + position;
  local_e0 = commands;
LAB_0010b3c6:
LAB_0010b3d4:
  uVar30 = position;
  if (uVar1 <= uVar30 + 4) {
    *last_insert_len = (local_118 + uVar1) - uVar30;
    *num_commands = *num_commands + ((long)local_e0 - (long)commands >> 4);
    return;
  }
  local_e8 = uVar1 - uVar30;
  uVar13 = uVar11;
  if (uVar30 < uVar11) {
    uVar13 = uVar30;
  }
  uVar23 = uVar30 & ringbuffer_mask;
  piVar2 = (int *)(ringbuffer + uVar23);
  uVar16 = (uint)(*(int *)(ringbuffer + uVar23) * 0x1e35a7bd) >> 0x11;
  uVar39 = (ulong)((uint)local_e8 & 7);
  local_130 = 0;
  local_c8 = 0x1f90;
  local_100 = 0;
  lVar29 = 0;
  local_150 = 0;
  bVar44 = false;
  do {
    if (lVar29 == 0x10) {
      uVar28 = uVar16 & 0x1ff;
      sVar8 = hasher->max_hops;
      uVar31 = uVar30 - hasher->addr[uVar16];
      uVar6 = hasher->head[uVar16];
      uVar32 = (ulong)(uVar28 << 0xb);
      bVar44 = !bVar44;
      uVar27 = 0;
      uVar24 = uVar31;
      sVar42 = sVar8;
      uVar40 = uVar6;
      do {
        uVar41 = uVar40;
        do {
          do {
            do {
              do {
                bVar43 = sVar42 == 0;
                sVar42 = sVar42 - 1;
                if ((bVar43) || (uVar27 = uVar27 + uVar24, uVar13 < uVar27)) {
                  uVar7 = hasher->free_slot_idx[uVar28];
                  hasher->free_slot_idx[uVar28] = uVar7 + 1;
                  uVar28 = uVar7 & 0x1ff;
                  hasher->tiny_hash[uVar30 & 0xffff] = (uint8_t)uVar16;
                  if (0xfffe < uVar31) {
                    uVar31 = 0xffff;
                  }
                  *(short *)((long)&hasher->banks[0].slots[uVar28].delta + uVar32) = (short)uVar31;
                  *(uint16_t *)((long)&hasher->banks[0].slots[uVar28].next + uVar32) = uVar6;
                  hasher->addr[uVar16] = (uint32_t)uVar30;
                  hasher->head[uVar16] = (uint16_t)uVar28;
                  if (!bVar44) {
                    local_108 = 0;
                    goto LAB_0010bb3e;
                  }
                  uVar23 = (hasher->dict_search_stats_).num_lookups;
                  local_150 = (hasher->dict_search_stats_).num_matches;
                  if (local_150 < uVar23 >> 7) goto LAB_0010b995;
                  uVar39 = (ulong)((uint)(*piVar2 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
                  local_108 = 0;
                  lVar29 = 0;
                  bVar44 = false;
                  goto LAB_0010b7e5;
                }
                uVar40 = *(uint16_t *)((long)&hasher->banks[0].slots[uVar41].next + uVar32);
                uVar24 = (ulong)*(ushort *)((long)&hasher->banks[0].slots[uVar41].delta + uVar32);
                uVar41 = uVar40;
              } while (ringbuffer_mask < local_150 + uVar23);
              uVar37 = uVar30 - uVar27 & ringbuffer_mask;
            } while ((ringbuffer_mask < uVar37 + local_150) ||
                    (ringbuffer[local_150 + uVar23] != ringbuffer[uVar37 + local_150]));
            uVar25 = 0;
            lVar29 = 0;
LAB_0010b643:
            uVar33 = uVar39;
            uVar34 = local_e8 & 0xfffffffffffffff8;
            if (local_e8 >> 3 == uVar25) {
              for (; (uVar25 = local_e8, uVar33 != 0 &&
                     (uVar25 = uVar34,
                     ringbuffer[uVar34 + uVar37] == *(uint8_t *)((long)piVar2 + uVar34)));
                  uVar34 = uVar34 + 1) {
                uVar33 = uVar33 - 1;
              }
            }
            else {
              if (*(ulong *)(piVar2 + uVar25 * 2) == *(ulong *)(ringbuffer + uVar25 * 8 + uVar37))
              goto code_r0x0010b65c;
              uVar25 = *(ulong *)(ringbuffer + uVar25 * 8 + uVar37) ^
                       *(ulong *)(piVar2 + uVar25 * 2);
              uVar37 = 0;
              if (uVar25 != 0) {
                for (; (uVar25 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                }
              }
              uVar25 = (uVar37 >> 3 & 0x1fffffff) - lVar29;
            }
          } while (uVar25 < 4);
          iVar10 = 0x1f;
          if ((uint)uVar27 != 0) {
            for (; (uint)uVar27 >> iVar10 == 0; iVar10 = iVar10 + -1) {
            }
          }
          uVar37 = (ulong)(iVar10 * -0x78 + 0x1e00) + uVar25 * 0x21c;
        } while (uVar37 <= local_c8);
        bVar44 = false;
        local_c8 = uVar37;
        local_150 = uVar25;
        local_130 = uVar27;
        local_100 = uVar25;
      } while( true );
    }
    uVar24 = (long)kDistanceCacheOffset[lVar29] + (long)dist_cache[kDistanceCacheIndex[lVar29]];
    uVar27 = uVar30 - uVar24;
    if ((((lVar29 == 0) || (hasher->tiny_hash[uVar27 & 0xffff] == (uint8_t)uVar16)) &&
        (uVar24 <= uVar13)) && (uVar27 < uVar30)) {
      uVar31 = 0;
      lVar36 = 0;
LAB_0010b4cc:
      uVar32 = local_e8 & 0xfffffffffffffff8;
      uVar37 = uVar39;
      if (local_e8 >> 3 == uVar31) {
        for (; (uVar31 = local_e8, uVar37 != 0 &&
               (uVar31 = uVar32,
               ringbuffer[uVar32 + (uVar27 & ringbuffer_mask)] ==
               *(uint8_t *)((long)piVar2 + uVar32))); uVar32 = uVar32 + 1) {
          uVar37 = uVar37 - 1;
        }
      }
      else {
        if (*(ulong *)(piVar2 + uVar31 * 2) ==
            *(ulong *)(ringbuffer + uVar31 * 8 + (uVar27 & ringbuffer_mask))) goto code_r0x0010b4e3;
        uVar31 = *(ulong *)(ringbuffer + uVar31 * 8 + (uVar27 & ringbuffer_mask)) ^
                 *(ulong *)(piVar2 + uVar31 * 2);
        uVar27 = 0;
        if (uVar31 != 0) {
          for (; (uVar31 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
          }
        }
        uVar31 = (uVar27 >> 3 & 0x1fffffff) - lVar36;
      }
      if ((1 < uVar31) &&
         (uVar27 = uVar31 * 0x21c + kDistanceShortCodeCost[lVar29], local_c8 < uVar27)) {
        bVar44 = true;
        local_c8 = uVar27;
        local_150 = uVar31;
        local_130 = uVar24;
        local_100 = uVar31;
      }
    }
    lVar29 = lVar29 + 1;
  } while( true );
LAB_0010b7e5:
  if (lVar29 == 2) goto LAB_0010b97e;
  uVar7 = kStaticDictionaryHash[uVar39];
  uVar23 = uVar23 + 1;
  (hasher->dict_search_stats_).num_lookups = uVar23;
  if (uVar7 != 0) {
    uVar24 = (ulong)(uVar7 & 0x1f);
    if (uVar24 <= local_e8) {
      lVar36 = uVar24 * (uVar7 >> 5) +
               (ulong)*(uint *)(&kBrotliDictionaryOffsetsByLength + uVar24 * 4);
      uVar16 = (uint)uVar7;
      uVar27 = (ulong)(uVar16 & 0x18);
      uVar31 = 0;
LAB_0010b86c:
      if ((uVar7 & 0x18) == uVar31) {
        uVar32 = (ulong)(uVar16 & 7);
        pcVar20 = &kBrotliDictionary + uVar31 + lVar36;
        for (; (bVar43 = uVar32 != 0, uVar32 = uVar32 - 1, uVar31 = (ulong)(uVar16 & 0x1f), bVar43
               && (uVar31 = uVar27, *(char *)((long)piVar2 + uVar27) == *pcVar20));
            uVar27 = uVar27 + 1) {
          pcVar20 = pcVar20 + 1;
        }
      }
      else {
        uVar32 = *(ulong *)(&kBrotliDictionary + uVar31 + lVar36);
        if (uVar32 == *(ulong *)((long)piVar2 + uVar31)) goto code_r0x0010b887;
        uVar32 = *(ulong *)((long)piVar2 + uVar31) ^ uVar32;
        uVar27 = 0;
        if (uVar32 != 0) {
          for (; (uVar32 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
          }
        }
        uVar31 = (uVar27 >> 3 & 0x1fffffff) + uVar31;
      }
      if ((uVar31 != 0) && (uVar24 < uVar31 + 10)) {
        uVar27 = (ulong)(uVar7 >> 5) + uVar13 + 1 +
                 ((ulong)""[uVar24 - uVar31] <<
                 ((&kBrotliDictionarySizeBitsByLength)[uVar24] & 0x3f));
        iVar10 = 0x1f;
        uVar16 = (uint)uVar27;
        if (uVar16 != 0) {
          for (; uVar16 >> iVar10 == 0; iVar10 = iVar10 + -1) {
          }
        }
        uVar32 = (uVar31 * 0x21c - (ulong)(uint)(iVar10 * 0x78)) + 0x1e00;
        if (local_c8 <= uVar32) {
          local_108 = uVar24 ^ uVar31;
          local_150 = local_150 + 1;
          (hasher->dict_search_stats_).num_matches = local_150;
          bVar44 = true;
          local_c8 = uVar32;
          local_100 = uVar31;
          local_130 = uVar27;
        }
      }
    }
  }
  lVar29 = lVar29 + 1;
  uVar39 = uVar39 + 1;
  goto LAB_0010b7e5;
LAB_0010b97e:
  if (bVar44) goto LAB_0010bb3e;
LAB_0010b995:
  local_118 = local_118 + 1;
  position = uVar30 + 1;
  if (uVar12 < position) {
    if (uVar12 + (uint)((int)lVar19 * 4) < position) {
      uVar13 = uVar30 + 0x11;
      if (uVar5 <= uVar30 + 0x11) {
        uVar13 = uVar5;
      }
      for (; position < uVar13; position = position + 4) {
        uVar16 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
        uVar26 = uVar16 & 0x1ff;
        uVar7 = hasher->free_slot_idx[uVar26];
        hasher->free_slot_idx[uVar26] = uVar7 + 1;
        uVar28 = uVar7 & 0x1ff;
        uVar30 = position - hasher->addr[uVar16];
        hasher->tiny_hash[position & 0xffff] = (uint8_t)uVar16;
        if (0xfffe < uVar30) {
          uVar30 = 0xffff;
        }
        *(short *)((long)&hasher->banks[0].slots[uVar28].delta + (ulong)(uVar26 << 0xb)) =
             (short)uVar30;
        *(uint16_t *)((long)&hasher->banks[0].slots[uVar28].next + (ulong)(uVar26 << 0xb)) =
             hasher->head[uVar16];
        hasher->addr[uVar16] = (uint32_t)position;
        hasher->head[uVar16] = (uint16_t)uVar28;
        local_118 = local_118 + 4;
      }
    }
    else {
      uVar13 = uVar30 + 9;
      if (uVar4 <= uVar30 + 9) {
        uVar13 = uVar4;
      }
      for (; position < uVar13; position = position + 2) {
        uVar16 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
        uVar26 = uVar16 & 0x1ff;
        uVar7 = hasher->free_slot_idx[uVar26];
        hasher->free_slot_idx[uVar26] = uVar7 + 1;
        uVar28 = uVar7 & 0x1ff;
        uVar30 = position - hasher->addr[uVar16];
        hasher->tiny_hash[position & 0xffff] = (uint8_t)uVar16;
        if (0xfffe < uVar30) {
          uVar30 = 0xffff;
        }
        *(short *)((long)&hasher->banks[0].slots[uVar28].delta + (ulong)(uVar26 << 0xb)) =
             (short)uVar30;
        *(uint16_t *)((long)&hasher->banks[0].slots[uVar28].next + (ulong)(uVar26 << 0xb)) =
             hasher->head[uVar16];
        hasher->addr[uVar16] = (uint32_t)position;
        hasher->head[uVar16] = (uint16_t)uVar28;
        local_118 = local_118 + 2;
      }
    }
  }
  goto LAB_0010b3d4;
LAB_0010bb3e:
  uVar12 = local_118 + 4;
  uVar13 = (lVar3 + num_bytes) - uVar30;
  iVar10 = 0;
LAB_0010bb61:
  uVar23 = (ulong)((uint)uVar13 & 7);
  local_e8 = local_e8 - 1;
  local_120 = local_100 - 1;
  if (local_e8 <= local_100 - 1) {
    local_120 = local_e8;
  }
  if (4 < params->quality) {
    local_120 = 0;
  }
  uVar39 = uVar30 + 1;
  uVar24 = uVar11;
  if (uVar39 < uVar11) {
    uVar24 = uVar39;
  }
  uVar32 = uVar39 & ringbuffer_mask;
  piVar2 = (int *)(ringbuffer + uVar32);
  uVar16 = (uint)(*(int *)(ringbuffer + uVar32) * 0x1e35a7bd) >> 0x11;
  uVar27 = 0x1f90;
  local_148 = 0;
  uVar31 = 0;
  lVar29 = 0;
  bVar44 = false;
  do {
    if (lVar29 == 0x10) {
      uVar28 = uVar16 & 0x1ff;
      uVar25 = uVar39 - hasher->addr[uVar16];
      uVar7 = hasher->head[uVar16];
      uVar33 = (ulong)(uVar28 << 0xb);
      bVar44 = !bVar44;
      uVar34 = 0;
      sVar42 = sVar8;
      uVar37 = uVar25;
      uVar21 = uVar7;
      do {
        uVar22 = uVar21;
        do {
          do {
            do {
              do {
                bVar43 = sVar42 == 0;
                sVar42 = sVar42 - 1;
                if ((bVar43) || (uVar34 = uVar34 + uVar37, uVar24 < uVar34)) {
                  uVar21 = hasher->free_slot_idx[uVar28];
                  hasher->free_slot_idx[uVar28] = uVar21 + 1;
                  uVar28 = uVar21 & 0x1ff;
                  hasher->tiny_hash[uVar39 & 0xffff] = (uint8_t)uVar16;
                  if (0xfffe < uVar25) {
                    uVar25 = 0xffff;
                  }
                  *(short *)((long)&hasher->banks[0].slots[uVar28].delta + uVar33) = (short)uVar25;
                  *(ushort *)((long)&hasher->banks[0].slots[uVar28].next + uVar33) = uVar7;
                  hasher->addr[uVar16] = (uint32_t)uVar39;
                  hasher->head[uVar16] = (uint16_t)uVar28;
                  uVar23 = uVar30;
                  uVar32 = local_118;
                  if (!bVar44) {
                    local_120 = 0;
                    goto LAB_0010c196;
                  }
                  uVar37 = (hasher->dict_search_stats_).num_lookups;
                  local_158 = (hasher->dict_search_stats_).num_matches;
                  if (local_158 < uVar37 >> 7) goto LAB_0010c221;
                  uVar25 = (ulong)((uint)(*piVar2 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
                  local_120 = 0;
                  lVar29 = 0;
                  bVar44 = false;
                  goto LAB_0010bf7c;
                }
                uVar21 = *(ushort *)((long)&hasher->banks[0].slots[uVar22].next + uVar33);
                uVar37 = (ulong)*(ushort *)((long)&hasher->banks[0].slots[uVar22].delta + uVar33);
                uVar22 = uVar21;
              } while (ringbuffer_mask < local_120 + uVar32);
              uVar35 = uVar39 - uVar34 & ringbuffer_mask;
            } while ((ringbuffer_mask < uVar35 + local_120) ||
                    (ringbuffer[local_120 + uVar32] != ringbuffer[uVar35 + local_120]));
            uVar38 = 0;
            lVar29 = 0;
LAB_0010bde3:
            if (uVar13 >> 3 == uVar38) {
              uVar14 = uVar23;
              for (uVar38 = -lVar29;
                  (bVar43 = uVar14 != 0, uVar14 = uVar14 - 1, bVar43 &&
                  (ringbuffer[uVar38 + uVar35] == *(uint8_t *)((long)piVar2 + uVar38)));
                  uVar38 = uVar38 + 1) {
              }
            }
            else {
              if (*(ulong *)(piVar2 + uVar38 * 2) == *(ulong *)(ringbuffer + uVar38 * 8 + uVar35))
              goto code_r0x0010bdfc;
              uVar38 = *(ulong *)(ringbuffer + uVar38 * 8 + uVar35) ^
                       *(ulong *)(piVar2 + uVar38 * 2);
              uVar35 = 0;
              if (uVar38 != 0) {
                for (; (uVar38 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                }
              }
              uVar38 = (uVar35 >> 3 & 0x1fffffff) - lVar29;
            }
          } while (uVar38 < 4);
          iVar9 = 0x1f;
          if ((uint)uVar34 != 0) {
            for (; (uint)uVar34 >> iVar9 == 0; iVar9 = iVar9 + -1) {
            }
          }
          uVar35 = (ulong)(iVar9 * -0x78 + 0x1e00) + uVar38 * 0x21c;
        } while (uVar35 <= uVar27);
        bVar44 = false;
        uVar31 = uVar38;
        uVar27 = uVar35;
        local_148 = uVar34;
        local_120 = uVar38;
      } while( true );
    }
    uVar37 = (long)kDistanceCacheOffset[lVar29] + (long)dist_cache[kDistanceCacheIndex[lVar29]];
    uVar25 = uVar39 - uVar37;
    if ((((lVar29 == 0) || (hasher->tiny_hash[uVar25 & 0xffff] == (uint8_t)uVar16)) &&
        (uVar37 <= uVar24)) && (uVar25 < uVar39)) {
      uVar33 = 0;
      lVar36 = 0;
LAB_0010bc6c:
      if (uVar13 >> 3 == uVar33) {
        uVar34 = uVar23;
        for (uVar33 = -lVar36;
            (bVar43 = uVar34 != 0, uVar34 = uVar34 - 1, bVar43 &&
            (ringbuffer[uVar33 + (uVar25 & ringbuffer_mask)] == *(uint8_t *)((long)piVar2 + uVar33))
            ); uVar33 = uVar33 + 1) {
        }
      }
      else {
        if (*(ulong *)(piVar2 + uVar33 * 2) ==
            *(ulong *)(ringbuffer + uVar33 * 8 + (uVar25 & ringbuffer_mask))) goto code_r0x0010bc8c;
        uVar33 = *(ulong *)(ringbuffer + uVar33 * 8 + (uVar25 & ringbuffer_mask)) ^
                 *(ulong *)(piVar2 + uVar33 * 2);
        uVar25 = 0;
        if (uVar33 != 0) {
          for (; (uVar33 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
          }
        }
        uVar33 = (uVar25 >> 3 & 0x1fffffff) - lVar36;
      }
      if ((1 < uVar33) &&
         (uVar25 = uVar33 * 0x21c + kDistanceShortCodeCost[lVar29], uVar27 < uVar25)) {
        bVar44 = true;
        uVar31 = uVar33;
        uVar27 = uVar25;
        local_148 = uVar37;
        local_120 = uVar33;
      }
    }
    lVar29 = lVar29 + 1;
  } while( true );
LAB_0010bf7c:
  if (lVar29 == 2) goto LAB_0010c183;
  uVar7 = kStaticDictionaryHash[uVar25];
  uVar37 = uVar37 + 1;
  (hasher->dict_search_stats_).num_lookups = uVar37;
  if (uVar7 != 0) {
    uVar33 = (ulong)(uVar7 & 0x1f);
    if (uVar33 <= local_e8) {
      lVar36 = uVar33 * (uVar7 >> 5) +
               (ulong)*(uint *)(&kBrotliDictionaryOffsetsByLength + uVar33 * 4);
      uVar16 = (uint)uVar7;
      uVar34 = (ulong)(uVar16 & 0x18);
      uVar35 = 0;
LAB_0010c001:
      if ((uVar7 & 0x18) == uVar35) {
        local_f8 = (ulong)(uVar16 & 7);
        pcVar20 = &kBrotliDictionary + uVar35 + lVar36;
        for (; (bVar43 = local_f8 != 0, local_f8 = local_f8 - 1, uVar35 = (ulong)(uVar16 & 0x1f),
               bVar43 && (uVar35 = uVar34, *(char *)((long)piVar2 + uVar34) == *pcVar20));
            uVar34 = uVar34 + 1) {
          pcVar20 = pcVar20 + 1;
        }
      }
      else {
        uVar38 = *(ulong *)(&kBrotliDictionary + uVar35 + lVar36);
        if (uVar38 == *(ulong *)((long)piVar2 + uVar35)) goto code_r0x0010c01d;
        uVar38 = *(ulong *)((long)piVar2 + uVar35) ^ uVar38;
        uVar34 = 0;
        if (uVar38 != 0) {
          for (; (uVar38 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
          }
        }
        uVar35 = (uVar34 >> 3 & 0x1fffffff) + uVar35;
      }
      if ((uVar35 != 0) && (uVar33 < uVar35 + 10)) {
        uVar34 = (ulong)(uVar7 >> 5) + uVar24 + 1 +
                 ((ulong)""[uVar33 - uVar35] <<
                 ((&kBrotliDictionarySizeBitsByLength)[uVar33] & 0x3f));
        iVar9 = 0x1f;
        uVar16 = (uint)uVar34;
        if (uVar16 != 0) {
          for (; uVar16 >> iVar9 == 0; iVar9 = iVar9 + -1) {
          }
        }
        uVar38 = (uVar35 * 0x21c - (ulong)(uint)(iVar9 * 0x78)) + 0x1e00;
        if (uVar27 <= uVar38) {
          local_120 = uVar33 ^ uVar35;
          local_158 = local_158 + 1;
          (hasher->dict_search_stats_).num_matches = local_158;
          bVar44 = true;
          uVar27 = uVar38;
          uVar31 = uVar35;
          local_148 = uVar34;
        }
      }
    }
  }
  lVar29 = lVar29 + 1;
  uVar25 = uVar25 + 1;
  goto LAB_0010bf7c;
LAB_0010c183:
  if (!bVar44) goto LAB_0010c221;
LAB_0010c196:
  if ((uVar27 < local_c8 + 700) ||
     (local_108 = local_120, local_100 = uVar31, uVar23 = uVar39, local_130 = local_148,
     uVar32 = uVar12, iVar10 == 3)) goto LAB_0010c221;
  local_118 = local_118 + 1;
  iVar10 = iVar10 + 1;
  uVar24 = uVar30 + 5;
  uVar13 = uVar13 - 1;
  uVar30 = uVar39;
  uVar32 = local_118;
  local_c8 = uVar27;
  if (uVar1 <= uVar24) goto LAB_0010c221;
  goto LAB_0010bb61;
code_r0x0010c01d:
  uVar35 = uVar35 + 8;
  goto LAB_0010c001;
LAB_0010c221:
  local_118 = uVar32;
  uVar12 = uVar11;
  if (uVar23 < uVar11) {
    uVar12 = uVar23;
  }
  if (uVar12 < local_130) {
LAB_0010c23f:
    uVar30 = local_130 + 0xf;
  }
  else {
    if (local_130 == (long)*dist_cache) {
      uVar30 = 0;
      goto LAB_0010c279;
    }
    uVar30 = 1;
    if (local_130 != (long)dist_cache[1]) {
      uVar30 = (local_130 + 3) - (long)*dist_cache;
      if (uVar30 < 7) {
        bVar15 = (byte)((int)uVar30 << 2);
        uVar16 = 0x9750468;
      }
      else {
        uVar30 = (local_130 + 3) - (long)dist_cache[1];
        if (6 < uVar30) {
          uVar30 = 2;
          if ((local_130 != (long)dist_cache[2]) && (uVar30 = 3, local_130 != (long)dist_cache[3]))
          goto LAB_0010c23f;
          goto LAB_0010c243;
        }
        bVar15 = (byte)((int)uVar30 << 2);
        uVar16 = 0xfdb1ace;
      }
      uVar30 = (ulong)(uVar16 >> (bVar15 & 0x1f) & 0xf);
    }
  }
LAB_0010c243:
  if ((local_130 <= uVar12) && (uVar30 != 0)) {
    dist_cache[3] = dist_cache[2];
    *(undefined8 *)(dist_cache + 1) = *(undefined8 *)dist_cache;
    *dist_cache = (int)local_130;
  }
LAB_0010c279:
  uVar16 = (uint)local_118;
  local_e0->insert_len_ = uVar16;
  local_e0->copy_len_ = (uint)local_100 | (int)local_108 << 0x18;
  if (uVar30 < 0x10) {
    uVar26 = 0;
  }
  else {
    uVar28 = 0x1f;
    uVar26 = (uint)(uVar30 - 0xc);
    if (uVar26 != 0) {
      for (; uVar26 >> uVar28 == 0; uVar28 = uVar28 - 1) {
      }
    }
    uVar17 = (uVar28 ^ 0xffffffe0) + 0x1f;
    bVar44 = (uVar30 - 0xc >> ((ulong)uVar17 & 0x3f) & 1) != 0;
    uVar26 = uVar26 - (bVar44 + 2 << ((byte)uVar17 & 0x3f)) | uVar17 * 0x1000000;
    uVar30 = (ulong)((uint)bVar44 + (uVar28 ^ 0xffffffe0) * 2 + 0x4c);
  }
  local_e0->dist_prefix_ = (uint16_t)uVar30;
  local_e0->dist_extra_ = uVar26;
  if (5 < local_118) {
    if (local_118 < 0x82) {
      uVar16 = 0x1f;
      uVar28 = (uint)(local_118 - 2);
      if (uVar28 != 0) {
        for (; uVar28 >> uVar16 == 0; uVar16 = uVar16 - 1) {
        }
      }
      uVar16 = (int)(local_118 - 2 >> ((char)(uVar16 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar16 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (local_118 < 0x842) {
      uVar28 = 0x1f;
      if (uVar16 - 0x42 != 0) {
        for (; uVar16 - 0x42 >> uVar28 == 0; uVar28 = uVar28 - 1) {
        }
      }
      uVar16 = (uVar28 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar16 = 0x15;
      if (0x1841 < local_118) {
        uVar16 = (uint)(ushort)(0x17 - (local_118 < 0x5842));
      }
    }
  }
  local_108 = local_108 ^ local_100;
  if (local_108 < 10) {
    uVar28 = (int)local_108 - 2;
  }
  else if (local_108 < 0x86) {
    uVar28 = 0x1f;
    uVar26 = (uint)(local_108 - 6);
    if (uVar26 != 0) {
      for (; uVar26 >> uVar28 == 0; uVar28 = uVar28 - 1) {
      }
    }
    uVar28 = (int)(local_108 - 6 >> ((char)(uVar28 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
             (uVar28 ^ 0xffffffe0) * 2 + 0x42;
  }
  else {
    uVar28 = 0x17;
    if (local_108 < 0x846) {
      uVar26 = (int)local_108 - 0x46;
      uVar28 = 0x1f;
      if (uVar26 != 0) {
        for (; uVar26 >> uVar28 == 0; uVar28 = uVar28 - 1) {
        }
      }
      uVar28 = (uVar28 ^ 0xffe0) + 0x2c;
    }
  }
  uVar7 = (ushort)uVar28;
  uVar21 = (uVar7 & 7) + ((ushort)uVar16 & 7) * 8;
  if ((((uint16_t)uVar30 == 0) && ((ushort)uVar16 < 8)) && (uVar7 < 0x10)) {
    if (7 < uVar7) {
      uVar21 = uVar21 | 0x40;
    }
  }
  else {
    uVar21 = uVar21 | *(ushort *)
                       (CombineLengthCodes_cells +
                       (ulong)(((uVar16 & 0xffff) >> 3) * 3 + ((uVar28 & 0xffff) >> 3)) * 2);
  }
  local_e0->cmd_prefix_ = uVar21;
  *num_literals = *num_literals + local_118;
  uVar12 = lVar19 + uVar23 + local_100 * 2;
  local_e0 = local_e0 + 1;
  position = local_100 + uVar23;
  uVar23 = uVar23 + 2;
  uVar30 = sVar18;
  if (position < sVar18) {
    uVar30 = position;
  }
  for (; uVar23 < uVar30; uVar23 = uVar23 + 1) {
    uVar16 = (uint)(*(int *)(ringbuffer + (uVar23 & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
    uVar26 = uVar16 & 0x1ff;
    uVar7 = hasher->free_slot_idx[uVar26];
    hasher->free_slot_idx[uVar26] = uVar7 + 1;
    uVar28 = uVar7 & 0x1ff;
    uVar13 = uVar23 - hasher->addr[uVar16];
    hasher->tiny_hash[uVar23 & 0xffff] = (uint8_t)uVar16;
    if (0xfffe < uVar13) {
      uVar13 = 0xffff;
    }
    *(short *)((long)&hasher->banks[0].slots[uVar28].delta + (ulong)(uVar26 << 0xb)) = (short)uVar13
    ;
    *(uint16_t *)((long)&hasher->banks[0].slots[uVar28].next + (ulong)(uVar26 << 0xb)) =
         hasher->head[uVar16];
    hasher->addr[uVar16] = (uint32_t)uVar23;
    hasher->head[uVar16] = (uint16_t)uVar28;
  }
  local_118 = 0;
  goto LAB_0010b3c6;
code_r0x0010bdfc:
  lVar29 = lVar29 + -8;
  uVar38 = uVar38 + 1;
  goto LAB_0010bde3;
code_r0x0010bc8c:
  lVar36 = lVar36 + -8;
  uVar33 = uVar33 + 1;
  goto LAB_0010bc6c;
code_r0x0010b887:
  uVar31 = uVar31 + 8;
  goto LAB_0010b86c;
code_r0x0010b65c:
  lVar29 = lVar29 + -8;
  uVar25 = uVar25 + 1;
  goto LAB_0010b643;
code_r0x0010b4e3:
  lVar36 = lVar36 + -8;
  uVar31 = uVar31 + 1;
  goto LAB_0010b4cc;
}

Assistant:

static BROTLI_NOINLINE void FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    const BrotliEncoderParams* params, Hasher* hasher, int* dist_cache,
    size_t* last_insert_len, Command* commands, size_t* num_commands,
    size_t* num_literals) {
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 400;

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_x_code = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    if (FN(FindLongestMatch)(hasher, ringbuffer, ringbuffer_mask, dist_cache,
                             position, max_length, max_distance, &sr)) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 700;
        BROTLI_BOOL is_match_found;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_x_code = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        is_match_found = FN(FindLongestMatch)(hasher, ringbuffer,
            ringbuffer_mask, dist_cache, position + 1, max_length, max_distance,
            &sr2);
        if (is_match_found && sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code =
            ComputeDistanceCode(sr.distance, max_distance, dist_cache);
        if (sr.distance <= max_distance && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
        }
        InitCommand(commands++, insert_length, sr.len, sr.len ^ sr.len_x_code,
            distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them. */
      FN(StoreRange)(hasher, ringbuffer, ringbuffer_mask, position + 2,
                     BROTLI_MIN(size_t, position + sr.len, store_end));
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}